

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O2

size_t ContentWriteFunction(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  LOGGER_LOG p_Var5;
  size_t __n;
  ulong uVar6;
  size_t __size;
  
  __n = nmemb * size;
  if (ptr != (void *)0x0 && userdata != (void *)0x0) {
    if (__n == 0) {
      __n = 0;
    }
    else {
      if (nmemb == 0 || size == 0) {
        uVar6 = 0;
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = size;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = nmemb;
        uVar6 = __n;
        if (SUB168(auVar2 * auVar3,8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
      }
      __size = uVar6 + *(ulong *)((long)userdata + 8);
      if (CARRY8(uVar6,*(ulong *)((long)userdata + 8))) {
        __size = 0xffffffffffffffff;
      }
      if (__size == 0xffffffffffffffff) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                    ,"ContentWriteFunction",0x132,1,"Invalid buffer size");
        }
      }
      else {
        pvVar4 = realloc(*userdata,__size);
        if (pvVar4 != (void *)0x0) {
          *(void **)userdata = pvVar4;
          lVar1 = *(long *)((long)userdata + 8);
          memcpy((void *)((long)pvVar4 + lVar1),ptr,__n);
          *(size_t *)((long)userdata + 8) = lVar1 + __n;
          return __n;
        }
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/httpapi_curl.c"
                  ,"ContentWriteFunction",0x142,1,"Could not allocate buffer of size %lu",__size);
      }
      *(undefined1 *)((long)userdata + 0x10) = 1;
      if (*userdata != (void *)0x0) {
        free(*userdata);
        *(undefined8 *)userdata = 0;
      }
    }
  }
  return __n;
}

Assistant:

static size_t ContentWriteFunction(void *ptr, size_t size, size_t nmemb, void *userdata)
{
    HTTP_RESPONSE_CONTENT_BUFFER* responseContentBuffer = (HTTP_RESPONSE_CONTENT_BUFFER*)userdata;
    if ((userdata != NULL) &&
        (ptr != NULL) &&
        (size * nmemb > 0))
    {
        size_t malloc_size = safe_multiply_size_t(size, nmemb);
        malloc_size = safe_add_size_t(malloc_size, responseContentBuffer->bufferSize);

        void* newBuffer;
        if (malloc_size == SIZE_MAX)
        {
            LogError("Invalid buffer size");
            newBuffer = NULL;
        }
        else
        {
            newBuffer = realloc(responseContentBuffer->buffer, malloc_size);
        }

        if (newBuffer != NULL)
        {
            responseContentBuffer->buffer = newBuffer;
            memcpy(responseContentBuffer->buffer + responseContentBuffer->bufferSize, ptr, size * nmemb);
            responseContentBuffer->bufferSize += size * nmemb;
        }
        else
        {
            LogError("Could not allocate buffer of size %lu", (unsigned long)(malloc_size));
            responseContentBuffer->error = 1;
            if (responseContentBuffer->buffer != NULL)
            {
                free(responseContentBuffer->buffer);
                responseContentBuffer->buffer = NULL;
            }
        }
    }

    return size * nmemb;
}